

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pager_playback_one_page(Pager *pPager,i64 *pOffset,Bitvec *pDone,int isMainJrnl,int isSavepnt)

{
  sqlite3_file *fd;
  sqlite3_io_methods *psVar1;
  void *__dest;
  undefined8 uVar2;
  u8 *aData;
  u32 cksum_1;
  int iVar3;
  u32 uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  u32 i;
  DbPage *pDVar8;
  bool bVar9;
  u32 cksum;
  Pgno pgno;
  DbPage *local_60;
  Bitvec *local_58;
  u32 local_50;
  uint local_4c;
  ulong local_48;
  u8 *local_40;
  long local_38;
  
  local_40 = (u8 *)pPager->pTmpSpace;
  fd = *(sqlite3_file **)(pPager->dbFileVers + (ulong)(isMainJrnl == 0) * 8 + -0x38);
  iVar3 = read32bits(fd,*pOffset,&local_4c);
  if (iVar3 != 0) {
    return iVar3;
  }
  local_58 = pDone;
  iVar3 = (*fd->pMethods->xRead)(fd,local_40,(int)pPager->pageSize,*pOffset + 4);
  aData = local_40;
  if (iVar3 != 0) {
    return iVar3;
  }
  lVar7 = *pOffset + (ulong)(uint)isMainJrnl * 4 + pPager->pageSize + 4;
  *pOffset = lVar7;
  local_48 = (ulong)local_4c;
  if (local_4c == 0) {
    return 0x65;
  }
  if (local_4c == pPager->lckPgno) {
    return 0x65;
  }
  if (pPager->dbSize < local_4c) {
    return 0;
  }
  i = local_4c;
  if (local_58 != (Bitvec *)0x0) {
    local_38 = lVar7;
    iVar3 = sqlite3BitvecTestNotNull(local_58,local_4c);
    i = (u32)local_48;
    lVar7 = local_38;
    if (iVar3 != 0) {
      return 0;
    }
  }
  if (isMainJrnl != 0) {
    iVar3 = read32bits(fd,lVar7 + -4,&local_50);
    if (iVar3 != 0) {
      return iVar3;
    }
    i = (u32)local_48;
    if (isSavepnt == 0) {
      uVar4 = pPager->cksumInit;
      uVar5 = (int)pPager->pageSize - 200;
      if (0 < (int)uVar5) {
        uVar6 = (ulong)uVar5 + 200;
        do {
          uVar4 = uVar4 + aData[uVar6 - 200];
          uVar6 = uVar6 - 200;
        } while (200 < uVar6);
      }
      if (uVar4 != local_50) {
        return 0x65;
      }
    }
  }
  if ((local_58 != (Bitvec *)0x0) && (iVar3 = sqlite3BitvecSet(local_58,i), iVar3 != 0)) {
    return iVar3;
  }
  if ((i == 1) && (pPager->nReserve != (ushort)aData[0x14])) {
    pPager->nReserve = (ushort)aData[0x14];
  }
  if (pPager->pWal == (Wal *)0x0) {
    local_60 = sqlite3PagerLookup(pPager,i);
    if (isMainJrnl != 0) goto LAB_0012f4f5;
    if (local_60 == (DbPage *)0x0) {
      bVar9 = true;
      pDVar8 = (DbPage *)0x0;
    }
    else {
      bVar9 = (local_60->flags & 8) == 0;
      pDVar8 = local_60;
    }
  }
  else {
    local_60 = (DbPage *)0x0;
    if (isMainJrnl == 0) {
      bVar9 = true;
      pDVar8 = (DbPage *)0x0;
    }
    else {
LAB_0012f4f5:
      bVar9 = true;
      pDVar8 = local_60;
      if (pPager->noSync == '\0') {
        bVar9 = *pOffset <= pPager->journalHdr;
      }
    }
  }
  psVar1 = pPager->fd->pMethods;
  if (psVar1 != (sqlite3_io_methods *)0x0) {
    if (pPager->eState < 4) {
      bVar9 = (bool)(pPager->eState == 0 & bVar9);
    }
    if (bVar9) {
      iVar3 = (*psVar1->xWrite)(pPager->fd,aData,(int)pPager->pageSize,
                                (ulong)(i - 1) * pPager->pageSize);
      if (pPager->dbFileSize < i) {
        pPager->dbFileSize = i;
      }
      if (pPager->pBackup != (sqlite3_backup *)0x0) {
        backupUpdate(pPager->pBackup,i,aData);
      }
      goto LAB_0012f5da;
    }
  }
  iVar3 = 0;
  if ((isMainJrnl == 0) && (pDVar8 == (DbPage *)0x0)) {
    pPager->doNotSpill = pPager->doNotSpill | 2;
    iVar3 = (*pPager->xGet)(pPager,i,&local_60,1);
    pPager->doNotSpill = pPager->doNotSpill & 0xfd;
    if (iVar3 != 0) {
      return iVar3;
    }
    sqlite3PcacheMakeDirty(local_60);
    iVar3 = 0;
    pDVar8 = local_60;
  }
LAB_0012f5da:
  if (pDVar8 != (DbPage *)0x0) {
    __dest = pDVar8->pData;
    memcpy(__dest,aData,pPager->pageSize);
    (*pPager->xReiniter)(local_60);
    if (i == 1) {
      uVar2 = *(undefined8 *)((long)__dest + 0x20);
      *(undefined8 *)pPager->dbFileVers = *(undefined8 *)((long)__dest + 0x18);
      *(undefined8 *)(pPager->dbFileVers + 8) = uVar2;
    }
    sqlite3PcacheRelease(local_60);
  }
  return iVar3;
}

Assistant:

static int pager_playback_one_page(
  Pager *pPager,                /* The pager being played back */
  i64 *pOffset,                 /* Offset of record to playback */
  Bitvec *pDone,                /* Bitvec of pages already played back */
  int isMainJrnl,               /* 1 -> main journal. 0 -> sub-journal. */
  int isSavepnt                 /* True for a savepoint rollback */
){
  int rc;
  PgHdr *pPg;                   /* An existing page in the cache */
  Pgno pgno;                    /* The page number of a page in journal */
  u32 cksum;                    /* Checksum used for sanity checking */
  char *aData;                  /* Temporary storage for the page */
  sqlite3_file *jfd;            /* The file descriptor for the journal file */
  int isSynced;                 /* True if journal page is synced */

  assert( (isMainJrnl&~1)==0 );      /* isMainJrnl is 0 or 1 */
  assert( (isSavepnt&~1)==0 );       /* isSavepnt is 0 or 1 */
  assert( isMainJrnl || pDone );     /* pDone always used on sub-journals */
  assert( isSavepnt || pDone==0 );   /* pDone never used on non-savepoint */

  aData = pPager->pTmpSpace;
  assert( aData );         /* Temp storage must have already been allocated */
  assert( pagerUseWal(pPager)==0 || (!isMainJrnl && isSavepnt) );

  /* Either the state is greater than PAGER_WRITER_CACHEMOD (a transaction
  ** or savepoint rollback done at the request of the caller) or this is
  ** a hot-journal rollback. If it is a hot-journal rollback, the pager
  ** is in state OPEN and holds an EXCLUSIVE lock. Hot-journal rollback
  ** only reads from the main journal, not the sub-journal.
  */
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD
       || (pPager->eState==PAGER_OPEN && pPager->eLock==EXCLUSIVE_LOCK)
  );
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD || isMainJrnl );

  /* Read the page number and page data from the journal or sub-journal
  ** file. Return an error code to the caller if an IO error occurs.
  */
  jfd = isMainJrnl ? pPager->jfd : pPager->sjfd;
  rc = read32bits(jfd, *pOffset, &pgno);
  if( rc!=SQLITE_OK ) return rc;
  rc = sqlite3OsRead(jfd, (u8*)aData, pPager->pageSize, (*pOffset)+4);
  if( rc!=SQLITE_OK ) return rc;
  *pOffset += pPager->pageSize + 4 + isMainJrnl*4;

  /* Sanity checking on the page.  This is more important that I originally
  ** thought.  If a power failure occurs while the journal is being written,
  ** it could cause invalid data to be written into the journal.  We need to
  ** detect this invalid data (with high probability) and ignore it.
  */
  if( pgno==0 || pgno==PAGER_SJ_PGNO(pPager) ){
    assert( !isSavepnt );
    return SQLITE_DONE;
  }
  if( pgno>(Pgno)pPager->dbSize || sqlite3BitvecTest(pDone, pgno) ){
    return SQLITE_OK;
  }
  if( isMainJrnl ){
    rc = read32bits(jfd, (*pOffset)-4, &cksum);
    if( rc ) return rc;
    if( !isSavepnt && pager_cksum(pPager, (u8*)aData)!=cksum ){
      return SQLITE_DONE;
    }
  }

  /* If this page has already been played back before during the current
  ** rollback, then don't bother to play it back again.
  */
  if( pDone && (rc = sqlite3BitvecSet(pDone, pgno))!=SQLITE_OK ){
    return rc;
  }

  /* When playing back page 1, restore the nReserve setting
  */
  if( pgno==1 && pPager->nReserve!=((u8*)aData)[20] ){
    pPager->nReserve = ((u8*)aData)[20];
  }

  /* If the pager is in CACHEMOD state, then there must be a copy of this
  ** page in the pager cache. In this case just update the pager cache,
  ** not the database file. The page is left marked dirty in this case.
  **
  ** An exception to the above rule: If the database is in no-sync mode
  ** and a page is moved during an incremental vacuum then the page may
  ** not be in the pager cache. Later: if a malloc() or IO error occurs
  ** during a Movepage() call, then the page may not be in the cache
  ** either. So the condition described in the above paragraph is not
  ** assert()able.
  **
  ** If in WRITER_DBMOD, WRITER_FINISHED or OPEN state, then we update the
  ** pager cache if it exists and the main file. The page is then marked
  ** not dirty. Since this code is only executed in PAGER_OPEN state for
  ** a hot-journal rollback, it is guaranteed that the page-cache is empty
  ** if the pager is in OPEN state.
  **
  ** Ticket #1171:  The statement journal might contain page content that is
  ** different from the page content at the start of the transaction.
  ** This occurs when a page is changed prior to the start of a statement
  ** then changed again within the statement.  When rolling back such a
  ** statement we must not write to the original database unless we know
  ** for certain that original page contents are synced into the main rollback
  ** journal.  Otherwise, a power loss might leave modified data in the
  ** database file without an entry in the rollback journal that can
  ** restore the database to its original form.  Two conditions must be
  ** met before writing to the database files. (1) the database must be
  ** locked.  (2) we know that the original page content is fully synced
  ** in the main journal either because the page is not in cache or else
  ** the page is marked as needSync==0.
  **
  ** 2008-04-14:  When attempting to vacuum a corrupt database file, it
  ** is possible to fail a statement on a database that does not yet exist.
  ** Do not attempt to write if database file has never been opened.
  */
  if( pagerUseWal(pPager) ){
    pPg = 0;
  }else{
    pPg = sqlite3PagerLookup(pPager, pgno);
  }
  assert( pPg || !MEMDB );
  assert( pPager->eState!=PAGER_OPEN || pPg==0 || pPager->tempFile );
  PAGERTRACE(("PLAYBACK %d page %d hash(%08x) %s\n",
           PAGERID(pPager), pgno, pager_datahash(pPager->pageSize, (u8*)aData),
           (isMainJrnl?"main-journal":"sub-journal")
  ));
  if( isMainJrnl ){
    isSynced = pPager->noSync || (*pOffset <= pPager->journalHdr);
  }else{
    isSynced = (pPg==0 || 0==(pPg->flags & PGHDR_NEED_SYNC));
  }
  if( isOpen(pPager->fd)
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
   && isSynced
  ){
    i64 ofst = (pgno-1)*(i64)pPager->pageSize;
    testcase( !isSavepnt && pPg!=0 && (pPg->flags&PGHDR_NEED_SYNC)!=0 );
    assert( !pagerUseWal(pPager) );

    /* Write the data read from the journal back into the database file.
    ** This is usually safe even for an encrypted database - as the data
    ** was encrypted before it was written to the journal file. The exception
    ** is if the data was just read from an in-memory sub-journal. In that
    ** case it must be encrypted here before it is copied into the database
    ** file.  */
    rc = sqlite3OsWrite(pPager->fd, (u8 *)aData, pPager->pageSize, ofst);

    if( pgno>pPager->dbFileSize ){
      pPager->dbFileSize = pgno;
    }
    if( pPager->pBackup ){
      sqlite3BackupUpdate(pPager->pBackup, pgno, (u8*)aData);
    }
  }else if( !isMainJrnl && pPg==0 ){
    /* If this is a rollback of a savepoint and data was not written to
    ** the database and the page is not in-memory, there is a potential
    ** problem. When the page is next fetched by the b-tree layer, it
    ** will be read from the database file, which may or may not be
    ** current.
    **
    ** There are a couple of different ways this can happen. All are quite
    ** obscure. When running in synchronous mode, this can only happen
    ** if the page is on the free-list at the start of the transaction, then
    ** populated, then moved using sqlite3PagerMovepage().
    **
    ** The solution is to add an in-memory page to the cache containing
    ** the data just read from the sub-journal. Mark the page as dirty
    ** and if the pager requires a journal-sync, then mark the page as
    ** requiring a journal-sync before it is written.
    */
    assert( isSavepnt );
    assert( (pPager->doNotSpill & SPILLFLAG_ROLLBACK)==0 );
    pPager->doNotSpill |= SPILLFLAG_ROLLBACK;
    rc = sqlite3PagerGet(pPager, pgno, &pPg, 1);
    assert( (pPager->doNotSpill & SPILLFLAG_ROLLBACK)!=0 );
    pPager->doNotSpill &= ~SPILLFLAG_ROLLBACK;
    if( rc!=SQLITE_OK ) return rc;
    sqlite3PcacheMakeDirty(pPg);
  }
  if( pPg ){
    /* No page should ever be explicitly rolled back that is in use, except
    ** for page 1 which is held in use in order to keep the lock on the
    ** database active. However such a page may be rolled back as a result
    ** of an internal error resulting in an automatic call to
    ** sqlite3PagerRollback().
    */
    void *pData;
    pData = pPg->pData;
    memcpy(pData, (u8*)aData, pPager->pageSize);
    pPager->xReiniter(pPg);
    /* It used to be that sqlite3PcacheMakeClean(pPg) was called here.  But
    ** that call was dangerous and had no detectable benefit since the cache
    ** is normally cleaned by sqlite3PcacheCleanAll() after rollback and so
    ** has been removed. */
    pager_set_pagehash(pPg);

    /* If this was page 1, then restore the value of Pager.dbFileVers.
    ** Do this before any decoding. */
    if( pgno==1 ){
      memcpy(&pPager->dbFileVers, &((u8*)pData)[24],sizeof(pPager->dbFileVers));
    }
    sqlite3PcacheRelease(pPg);
  }
  return rc;
}